

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.cpp
# Opt level: O2

bool __thiscall Tetris::isValid(Tetris *this,int x,int y,int o)

{
  int iVar1;
  int iVar2;
  long lVar3;
  bool bVar4;
  
  if (x == -1) {
    x = this->blockX;
  }
  if (y == -1) {
    y = this->blockY;
  }
  if (o == -1) {
    o = this->orientation;
  }
  if (3 < (uint)o) {
    return false;
  }
  lVar3 = 0;
  do {
    bVar4 = lVar3 == 4;
    if (bVar4) {
      return bVar4;
    }
    iVar1 = this->shape[(uint)o][lVar3 * 2];
    if ((iVar1 + x) - 0x15U < 0xffffffec) {
      return bVar4;
    }
    iVar2 = this->shape[(uint)o][lVar3 * 2 + 1];
    if ((iVar2 + y) - 0xbU < 0xfffffff6) {
      return bVar4;
    }
    lVar3 = lVar3 + 1;
  } while (this->gameBoard->gridInfo[this->color][(uint)(iVar1 + x)][(uint)(iVar2 + y)] == 0);
  return bVar4;
}

Assistant:

bool Tetris::isValid(int x, int y, int o)
{
    x = x == -1 ? blockX : x;
    y = y == -1 ? blockY : y;
    o = o == -1 ? orientation : o;
    if (o < 0 || o > 3)
        return false;

    int i, tmpX, tmpY;
    for (i = 0; i < 4; i++) {
        tmpX = x + shape[o][2 * i];
        tmpY = y + shape[o][2 * i + 1];
        if (tmpX < 1 || tmpY > MAPWIDTH ||
            tmpY < 1 || tmpX > MAPHEIGHT ||
            gameBoard->gridInfo[color][tmpX][tmpY] != 0)
            return false;
    }
    return true;
}